

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O2

void __thiscall
arangodb::velocypack::Buffer<unsigned_char>::grow(Buffer<unsigned_char> *this,ValueLength len)

{
  ValueLength VVar1;
  uchar *ptr;
  size_t sVar2;
  ulong __size;
  undefined1 auVar3 [16];
  double dVar4;
  undefined1 auVar5 [16];
  
  VVar1 = this->_size;
  sVar2 = len + VVar1;
  auVar3._8_4_ = (int)(sVar2 >> 0x20);
  auVar3._0_8_ = sVar2;
  auVar3._12_4_ = 0x45300000;
  auVar5._8_4_ = (int)(VVar1 >> 0x20);
  auVar5._0_8_ = VVar1;
  auVar5._12_4_ = 0x45300000;
  dVar4 = (((double)CONCAT44(0x43300000,(int)VVar1) - 4503599627370496.0) +
          (auVar5._8_8_ - 1.9342813113834067e+25)) * 1.5;
  __size = (long)(dVar4 - 9.223372036854776e+18) & (long)dVar4 >> 0x3f | (long)dVar4;
  if (dVar4 <= ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0) +
               (auVar3._8_8_ - 1.9342813113834067e+25)) {
    __size = sVar2;
  }
  if (this->_buffer == this->_local) {
    ptr = (uchar *)malloc(__size);
    ensureValidPointer(this,ptr);
    memcpy(ptr,this->_buffer,this->_size);
  }
  else {
    ptr = (uchar *)realloc(this->_buffer,__size);
    ensureValidPointer(this,ptr);
  }
  this->_buffer = ptr;
  this->_capacity = __size;
  return;
}

Assistant:

void grow(ValueLength len) {
    VELOCYPACK_ASSERT(_size + len >= sizeof(_local));

    // need reallocation
    ValueLength newLen = _size + len;
    constexpr double growthFactor = 1.5;
    if (newLen < growthFactor * _size) {
      // ensure the buffer grows sensibly and not by 1 byte only
      newLen = static_cast<ValueLength>(growthFactor * _size);
    }
    VELOCYPACK_ASSERT(newLen > _size);

    // intentionally do not initialize memory here
    // intentionally also do not care about alignments here, as we
    // expect T to be 1-byte-aignable
    VELOCYPACK_ASSERT(newLen > 0);
    T* p;
    if (_buffer != _local) {
      p = static_cast<T*>(velocypack_realloc(_buffer, checkOverflow(newLen)));
      ensureValidPointer(p);
      // realloc will have copied the old data
    } else {
      p = static_cast<T*>(velocypack_malloc(checkOverflow(newLen)));
      ensureValidPointer(p);
      // copy existing data into buffer
      memcpy(p, _buffer, checkOverflow(_size));
    }
    poison(p + _capacity, newLen - _capacity);

    _buffer = p;
    _capacity = newLen;

    VELOCYPACK_ASSERT(_size <= _capacity);
  }